

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_file_nametoolong(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined1 *__s;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  uv_fs_t *__s1;
  char *pcVar5;
  char *pcVar6;
  uv_fs_t *puVar7;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_loop_t **unaff_R15;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_buf_t uVar8;
  uv_fs_t req;
  char name [65537];
  uv_loop_t *puStack_10488;
  uint uStack_10480;
  char *pcStack_10478;
  char *pcStack_10470;
  uv_fs_t *puStack_10460;
  code *pcStack_10458;
  code *pcStack_10450;
  uv_loop_t *puStack_10448;
  uint uStack_10440;
  char *pcStack_10438;
  undefined1 auStack_103a0 [88];
  long lStack_10348;
  code *pcStack_101e8;
  code *pcStack_101e0;
  undefined1 auStack_101d0 [88];
  long lStack_10178;
  undefined1 auStack_10018 [65552];
  
  pcStack_101e0 = (code *)0x152933;
  loop = (uv_loop_t *)uv_default_loop();
  __s = auStack_10018;
  pcStack_101e0 = (code *)0x152954;
  memset(__s,0x61,0x10000);
  puVar3 = (uv_loop_t *)0x0;
  pcStack_101e0 = (code *)0x152972;
  iVar1 = uv_fs_open(0,auStack_101d0,__s,0,0,0);
  if (iVar1 == -0x24) {
    if (lStack_10178 != -0x24) goto LAB_00152a1f;
    __s = auStack_101d0;
    pcStack_101e0 = (code *)0x152994;
    uv_fs_req_cleanup(__s);
    pcStack_101e0 = (code *)0x1529b7;
    puVar3 = loop;
    iVar1 = uv_fs_open(loop,__s,auStack_10018,0,0,open_nametoolong_cb);
    if (iVar1 != 0) goto LAB_00152a24;
    if (open_cb_count != 0) goto LAB_00152a29;
    pcStack_101e0 = (code *)0x1529d2;
    puVar3 = loop;
    uv_run(loop,0);
    if (open_cb_count != 1) goto LAB_00152a2e;
    pcStack_101e0 = (code *)0x1529e0;
    __s = (undefined1 *)uv_default_loop();
    pcStack_101e0 = (code *)0x1529f4;
    uv_walk(__s,close_walk_cb,0);
    pcStack_101e0 = (code *)0x1529fe;
    uv_run(__s,0);
    pcStack_101e0 = (code *)0x152a03;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_101e0 = (code *)0x152a0b;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_101e0 = (code *)0x152a1f;
    run_test_fs_file_nametoolong_cold_1();
LAB_00152a1f:
    pcStack_101e0 = (code *)0x152a24;
    run_test_fs_file_nametoolong_cold_2();
LAB_00152a24:
    pcStack_101e0 = (code *)0x152a29;
    run_test_fs_file_nametoolong_cold_3();
LAB_00152a29:
    pcStack_101e0 = (code *)0x152a2e;
    run_test_fs_file_nametoolong_cold_4();
LAB_00152a2e:
    pcStack_101e0 = (code *)0x152a33;
    run_test_fs_file_nametoolong_cold_5();
  }
  pcStack_101e0 = open_nametoolong_cb;
  run_test_fs_file_nametoolong_cold_6();
  if (puVar3->backend_fd == 1) {
    if (puVar3->watcher_queue[0] == (void *)0xffffffffffffffdc) {
      open_cb_count = open_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_101e8 = (code *)0x152a57;
    open_nametoolong_cb_cold_1();
  }
  pcStack_101e8 = run_test_fs_file_loop;
  open_nametoolong_cb_cold_2();
  pcStack_101e8 = (code *)__s;
  loop = (uv_loop_t *)uv_default_loop();
  unlink("test_symlink");
  puVar3 = (uv_loop_t *)0x0;
  iVar1 = uv_fs_symlink(0,auStack_103a0,"test_symlink","test_symlink",0,0);
  if (iVar1 == 0) {
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_open(0,auStack_103a0,"test_symlink",0,0,0);
    if (iVar1 != -0x28) goto LAB_00152b7d;
    if (lStack_10348 != -0x28) goto LAB_00152b82;
    uv_fs_req_cleanup(auStack_103a0);
    puVar3 = loop;
    iVar1 = uv_fs_open(loop,auStack_103a0,"test_symlink",0,0,open_loop_cb);
    if (iVar1 != 0) goto LAB_00152b87;
    if (open_cb_count != 0) goto LAB_00152b8c;
    puVar3 = loop;
    uv_run(loop,0);
    if (open_cb_count != 1) goto LAB_00152b91;
    unlink("test_symlink");
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    puVar3 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_file_loop_cold_1();
LAB_00152b7d:
    run_test_fs_file_loop_cold_2();
LAB_00152b82:
    run_test_fs_file_loop_cold_3();
LAB_00152b87:
    run_test_fs_file_loop_cold_4();
LAB_00152b8c:
    run_test_fs_file_loop_cold_5();
LAB_00152b91:
    run_test_fs_file_loop_cold_6();
  }
  run_test_fs_file_loop_cold_7();
  if (puVar3->backend_fd == 1) {
    if (puVar3->watcher_queue[0] == (void *)0xffffffffffffffd8) {
      open_cb_count = open_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    open_loop_cb_cold_1();
  }
  open_loop_cb_cold_2();
  unlink("test_file");
  unlink("test_file2");
  puVar3 = (uv_loop_t *)uv_default_loop();
  loop = puVar3;
  iVar1 = uv_fs_open(puVar3,&open_req1,"test_file",0x41,0x180,create_cb);
  if (iVar1 == 0) {
    puVar3 = loop;
    uv_run(loop,0);
    if (create_cb_count != 1) goto LAB_00152e6b;
    if (write_cb_count != 1) goto LAB_00152e70;
    if (fsync_cb_count != 1) goto LAB_00152e75;
    if (fdatasync_cb_count != 1) goto LAB_00152e7a;
    if (close_cb_count != 1) goto LAB_00152e7f;
    puVar3 = loop;
    iVar1 = uv_fs_rename(loop,&rename_req,"test_file","test_file2",rename_cb);
    if (iVar1 != 0) goto LAB_00152e84;
    puVar3 = loop;
    uv_run(loop,0);
    if (create_cb_count != 1) goto LAB_00152e89;
    if (write_cb_count != 1) goto LAB_00152e8e;
    if (close_cb_count != 1) goto LAB_00152e93;
    if (rename_cb_count != 1) goto LAB_00152e98;
    puVar3 = loop;
    iVar1 = uv_fs_open(loop,&open_req1,"test_file2",2,0,open_cb);
    if (iVar1 != 0) goto LAB_00152e9d;
    puVar3 = loop;
    uv_run(loop,0);
    if (open_cb_count != 1) goto LAB_00152ea2;
    if (read_cb_count != 1) goto LAB_00152ea7;
    if (close_cb_count != 2) goto LAB_00152eac;
    if (rename_cb_count != 1) goto LAB_00152eb1;
    if (create_cb_count != 1) goto LAB_00152eb6;
    if (write_cb_count != 1) goto LAB_00152ebb;
    if (ftruncate_cb_count != 1) goto LAB_00152ec0;
    puVar3 = loop;
    iVar1 = uv_fs_open(loop,&open_req1,"test_file2",0,0,open_cb);
    if (iVar1 != 0) goto LAB_00152ec5;
    puVar3 = loop;
    uv_run(loop,0);
    if (open_cb_count != 2) goto LAB_00152eca;
    if (read_cb_count != 2) goto LAB_00152ecf;
    if (close_cb_count != 3) goto LAB_00152ed4;
    if (rename_cb_count != 1) goto LAB_00152ed9;
    if (unlink_cb_count != 1) goto LAB_00152ede;
    if (create_cb_count != 1) goto LAB_00152ee3;
    if (write_cb_count != 1) goto LAB_00152ee8;
    if (ftruncate_cb_count != 1) goto LAB_00152eed;
    unlink("test_file");
    unlink("test_file2");
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    puVar3 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_file_async_cold_1();
LAB_00152e6b:
    run_test_fs_file_async_cold_2();
LAB_00152e70:
    run_test_fs_file_async_cold_3();
LAB_00152e75:
    run_test_fs_file_async_cold_4();
LAB_00152e7a:
    run_test_fs_file_async_cold_5();
LAB_00152e7f:
    run_test_fs_file_async_cold_6();
LAB_00152e84:
    run_test_fs_file_async_cold_7();
LAB_00152e89:
    run_test_fs_file_async_cold_8();
LAB_00152e8e:
    run_test_fs_file_async_cold_9();
LAB_00152e93:
    run_test_fs_file_async_cold_10();
LAB_00152e98:
    run_test_fs_file_async_cold_11();
LAB_00152e9d:
    run_test_fs_file_async_cold_12();
LAB_00152ea2:
    run_test_fs_file_async_cold_13();
LAB_00152ea7:
    run_test_fs_file_async_cold_14();
LAB_00152eac:
    run_test_fs_file_async_cold_15();
LAB_00152eb1:
    run_test_fs_file_async_cold_16();
LAB_00152eb6:
    run_test_fs_file_async_cold_17();
LAB_00152ebb:
    run_test_fs_file_async_cold_18();
LAB_00152ec0:
    run_test_fs_file_async_cold_19();
LAB_00152ec5:
    run_test_fs_file_async_cold_20();
LAB_00152eca:
    run_test_fs_file_async_cold_21();
LAB_00152ecf:
    run_test_fs_file_async_cold_22();
LAB_00152ed4:
    run_test_fs_file_async_cold_23();
LAB_00152ed9:
    run_test_fs_file_async_cold_24();
LAB_00152ede:
    run_test_fs_file_async_cold_25();
LAB_00152ee3:
    run_test_fs_file_async_cold_26();
LAB_00152ee8:
    run_test_fs_file_async_cold_27();
LAB_00152eed:
    run_test_fs_file_async_cold_28();
  }
  run_test_fs_file_async_cold_29();
  if (puVar3 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_00152f8f;
    if (open_req1.result._4_4_ < 0) goto LAB_00152f94;
    create_cb_count = create_cb_count + 1;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    puVar3 = loop;
    iVar1 = uv_fs_write(loop,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 == 0) {
      return 0x15a124;
    }
  }
  else {
    create_cb_cold_1();
LAB_00152f8f:
    create_cb_cold_2();
LAB_00152f94:
    create_cb_cold_3();
  }
  create_cb_cold_4();
  if (puVar3 == (uv_loop_t *)&rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_00152fd6;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(&rename_req);
      return iVar1;
    }
  }
  else {
    rename_cb_cold_1();
LAB_00152fd6:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (puVar3 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_001530c7;
    iVar1 = (int)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_001530cc;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_001530d1;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_001530d6;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar3 = loop;
    iov = uVar8;
    iVar2 = uv_fs_read(loop,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    iVar1 = (int)puVar3;
    if (iVar2 == 0) {
      return 0x15a2de;
    }
  }
  else {
    open_cb_cold_1();
LAB_001530c7:
    iVar1 = (int)puVar3;
    open_cb_cold_2();
LAB_001530cc:
    open_cb_cold_6();
LAB_001530d1:
    open_cb_cold_5();
LAB_001530d6:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(iVar1);
  fs_file_sync(iVar1);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar1 = uv_loop_close(uVar4);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar3 = (uv_loop_t *)uv_default_loop();
  loop = puVar3;
  iVar1 = uv_fs_open(puVar3,&open_req1,"test_file",0x41,0x180,0);
  iVar2 = (int)puVar3;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_0015352f:
    fs_file_sync_cold_2();
LAB_00153534:
    fs_file_sync_cold_3();
LAB_00153539:
    fs_file_sync_cold_4();
LAB_0015353e:
    fs_file_sync_cold_5();
LAB_00153543:
    fs_file_sync_cold_6();
LAB_00153548:
    fs_file_sync_cold_7();
LAB_0015354d:
    fs_file_sync_cold_8();
LAB_00153552:
    fs_file_sync_cold_9();
LAB_00153557:
    fs_file_sync_cold_10();
LAB_0015355c:
    fs_file_sync_cold_11();
LAB_00153561:
    fs_file_sync_cold_12();
LAB_00153566:
    fs_file_sync_cold_13();
LAB_0015356b:
    fs_file_sync_cold_14();
LAB_00153570:
    fs_file_sync_cold_15();
LAB_00153575:
    fs_file_sync_cold_16();
LAB_0015357a:
    fs_file_sync_cold_17();
LAB_0015357f:
    fs_file_sync_cold_18();
LAB_00153584:
    fs_file_sync_cold_19();
LAB_00153589:
    fs_file_sync_cold_20();
LAB_0015358e:
    fs_file_sync_cold_21();
LAB_00153593:
    fs_file_sync_cold_22();
LAB_00153598:
    fs_file_sync_cold_23();
LAB_0015359d:
    fs_file_sync_cold_24();
LAB_001535a2:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015352f;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar2 = 0;
    iov = uVar8;
    iVar1 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_00153534;
    if (write_req.result < 0) goto LAB_00153539;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015353e;
    if (close_req.result != 0) goto LAB_00153543;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_open(0,&open_req1,"test_file",2,0,0);
    if (iVar1 < 0) goto LAB_00153548;
    if (open_req1.result._4_4_ < 0) goto LAB_0015354d;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar8;
    iVar1 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_00153552;
    if (read_req.result < 0) goto LAB_00153557;
    iVar2 = 0x2e3070;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015355c;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_ftruncate(0,&ftruncate_req,(int)open_req1.result,7,0);
    if (iVar1 != 0) goto LAB_00153561;
    if (ftruncate_req.result != 0) goto LAB_00153566;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015356b;
    if (close_req.result != 0) goto LAB_00153570;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar1 != 0) goto LAB_00153575;
    if (rename_req.result != 0) goto LAB_0015357a;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar1 < 0) goto LAB_0015357f;
    if (open_req1.result._4_4_ < 0) goto LAB_00153584;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar8;
    iVar1 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_00153589;
    if (read_req.result < 0) goto LAB_0015358e;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_00153593;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_00153598;
    if (close_req.result != 0) goto LAB_0015359d;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_unlink(0,&unlink_req,"test_file2",0);
    if (iVar1 != 0) goto LAB_001535a2;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      iVar1 = unlink("test_file2");
      return iVar1;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(iVar2);
  fs_file_write_null_buffer(iVar2);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar1 = uv_loop_close(uVar4);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_001536fc:
    fs_file_write_null_buffer_cold_2();
LAB_00153701:
    fs_file_write_null_buffer_cold_3();
LAB_00153706:
    fs_file_write_null_buffer_cold_4();
LAB_0015370b:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001536fc;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(0,0);
    iov = uVar8;
    iVar1 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_00153701;
    if (write_req.result != 0) goto LAB_00153706;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015370b;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar1 = unlink("test_file");
      return iVar1;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStack_10438 = "test_file";
  pcStack_10450 = (code *)0x15372e;
  unlink("test_dir/file1");
  pcStack_10450 = (code *)0x15373a;
  unlink("test_dir/file2");
  pcVar5 = "test_dir";
  pcStack_10450 = (code *)0x153749;
  rmdir("test_dir");
  pcStack_10450 = (code *)0x15374e;
  __s1 = (uv_fs_t *)uv_default_loop();
  pcStack_10450 = (code *)0x153773;
  loop = (uv_loop_t *)__s1;
  iVar1 = uv_fs_mkdir(__s1,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStack_10450 = (code *)0x153789;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00153b91;
    __s1 = (uv_fs_t *)0x0;
    pcStack_10450 = (code *)0x1537b9;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_00153b96;
    pcStack_10450 = (code *)0x1537cd;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_10450 = (code *)0x1537e3;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_00153b9b;
    pcStack_10450 = (code *)0x1537f7;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_10450 = (code *)0x15381a;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_00153ba0;
    pcStack_10450 = (code *)0x15382e;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_10450 = (code *)0x153844;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_00153ba5;
    pcStack_10450 = (code *)0x153858;
    uv_fs_req_cleanup(&close_req);
    pcStack_10450 = (code *)0x15387b;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_00153baa;
    pcStack_10450 = (code *)0x153891;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_00153baf;
    __s1 = (uv_fs_t *)0x0;
    pcStack_10450 = (code *)0x1538b8;
    iVar1 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
    if (iVar1 != 2) goto LAB_00153bb4;
    if (scandir_req.result != 2) goto LAB_00153bb9;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00153bbe;
    pcStack_10450 = (code *)0x1538ec;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_10448);
    if (iVar1 != -0xfff) {
      pcVar5 = "file1";
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        __s1 = (uv_fs_t *)puStack_10448;
        pcVar6 = "file1";
        pcStack_10450 = (code *)0x15391a;
        iVar1 = strcmp((char *)puStack_10448,"file1");
        if (iVar1 != 0) {
          pcVar6 = "file2";
          pcStack_10450 = (code *)0x153929;
          iVar1 = strcmp((char *)__s1,"file2");
          if (iVar1 != 0) {
            pcStack_10450 = (code *)0x153b8c;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &puStack_10448;
            goto LAB_00153b8c;
          }
        }
        dent.name = (char *)(ulong)uStack_10440;
        pcStack_10450 = (code *)0x15393a;
        dent._8_8_ = pcVar6;
        assert_is_file_type(dent);
        pcStack_10450 = (code *)0x153945;
        iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_10448);
        unaff_R15 = &puStack_10448;
      } while (iVar1 != -0xfff);
    }
    __s1 = &scandir_req;
    pcStack_10450 = (code *)0x153958;
    uv_fs_req_cleanup();
    if (scandir_req.ptr != (void *)0x0) goto LAB_00153bc3;
    pcStack_10450 = (code *)0x153987;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00153bc8;
    pcStack_10450 = (code *)0x15399d;
    uv_run(loop,0);
    pcStack_10450 = (code *)0x1539be;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00153bcd;
    pcStack_10450 = (code *)0x1539d4;
    uv_run(loop,0);
    pcStack_10450 = (code *)0x1539f5;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00153bd2;
    pcStack_10450 = (code *)0x153a0b;
    uv_run(loop,0);
    pcStack_10450 = (code *)0x153a2c;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00153bd7;
    pcStack_10450 = (code *)0x153a42;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (stat_cb_count != 4) goto LAB_00153bdc;
    pcStack_10450 = (code *)0x153a70;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00153be1;
    pcStack_10450 = (code *)0x153a86;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 1) goto LAB_00153be6;
    pcStack_10450 = (code *)0x153ab4;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_00153beb;
    pcStack_10450 = (code *)0x153aca;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 2) goto LAB_00153bf0;
    pcStack_10450 = (code *)0x153af8;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_00153bf5;
    pcStack_10450 = (code *)0x153b0e;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (rmdir_cb_count != 1) goto LAB_00153bfa;
    pcStack_10450 = (code *)0x153b27;
    unlink("test_dir/file1");
    pcStack_10450 = (code *)0x153b33;
    unlink("test_dir/file2");
    pcStack_10450 = (code *)0x153b3f;
    rmdir("test_dir");
    pcStack_10450 = (code *)0x153b44;
    pcVar5 = (char *)uv_default_loop();
    pcStack_10450 = (code *)0x153b58;
    uv_walk(pcVar5,close_walk_cb,0);
    pcStack_10450 = (code *)0x153b62;
    uv_run(pcVar5,0);
    pcStack_10450 = (code *)0x153b67;
    __s1 = (uv_fs_t *)uv_default_loop();
    pcStack_10450 = (code *)0x153b6f;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00153b8c:
    pcStack_10450 = (code *)0x153b91;
    run_test_fs_async_dir_cold_1();
LAB_00153b91:
    pcStack_10450 = (code *)0x153b96;
    run_test_fs_async_dir_cold_2();
LAB_00153b96:
    pcStack_10450 = (code *)0x153b9b;
    run_test_fs_async_dir_cold_3();
LAB_00153b9b:
    pcStack_10450 = (code *)0x153ba0;
    run_test_fs_async_dir_cold_4();
LAB_00153ba0:
    pcStack_10450 = (code *)0x153ba5;
    run_test_fs_async_dir_cold_5();
LAB_00153ba5:
    pcStack_10450 = (code *)0x153baa;
    run_test_fs_async_dir_cold_6();
LAB_00153baa:
    pcStack_10450 = (code *)0x153baf;
    run_test_fs_async_dir_cold_7();
LAB_00153baf:
    pcStack_10450 = (code *)0x153bb4;
    run_test_fs_async_dir_cold_8();
LAB_00153bb4:
    pcStack_10450 = (code *)0x153bb9;
    run_test_fs_async_dir_cold_9();
LAB_00153bb9:
    pcStack_10450 = (code *)0x153bbe;
    run_test_fs_async_dir_cold_10();
LAB_00153bbe:
    pcStack_10450 = (code *)0x153bc3;
    run_test_fs_async_dir_cold_25();
LAB_00153bc3:
    pcStack_10450 = (code *)0x153bc8;
    run_test_fs_async_dir_cold_12();
LAB_00153bc8:
    pcStack_10450 = (code *)0x153bcd;
    run_test_fs_async_dir_cold_13();
LAB_00153bcd:
    pcStack_10450 = (code *)0x153bd2;
    run_test_fs_async_dir_cold_14();
LAB_00153bd2:
    pcStack_10450 = (code *)0x153bd7;
    run_test_fs_async_dir_cold_15();
LAB_00153bd7:
    pcStack_10450 = (code *)0x153bdc;
    run_test_fs_async_dir_cold_16();
LAB_00153bdc:
    pcStack_10450 = (code *)0x153be1;
    run_test_fs_async_dir_cold_17();
LAB_00153be1:
    pcStack_10450 = (code *)0x153be6;
    run_test_fs_async_dir_cold_18();
LAB_00153be6:
    pcStack_10450 = (code *)0x153beb;
    run_test_fs_async_dir_cold_19();
LAB_00153beb:
    pcStack_10450 = (code *)0x153bf0;
    run_test_fs_async_dir_cold_20();
LAB_00153bf0:
    pcStack_10450 = (code *)0x153bf5;
    run_test_fs_async_dir_cold_21();
LAB_00153bf5:
    pcStack_10450 = (code *)0x153bfa;
    run_test_fs_async_dir_cold_22();
LAB_00153bfa:
    pcStack_10450 = (code *)0x153bff;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_10450 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (__s1 == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00153c5e;
    if (mkdir_req.result != 0) goto LAB_00153c63;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00153c68;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      iVar1 = uv_fs_req_cleanup(&mkdir_req);
      return iVar1;
    }
  }
  else {
    pcStack_10458 = (code *)0x153c5e;
    mkdir_cb_cold_1();
LAB_00153c5e:
    pcStack_10458 = (code *)0x153c63;
    mkdir_cb_cold_2();
LAB_00153c63:
    pcStack_10458 = (code *)0x153c68;
    mkdir_cb_cold_3();
LAB_00153c68:
    pcStack_10458 = (code *)0x153c6d;
    mkdir_cb_cold_5();
  }
  pcStack_10458 = scandir_cb;
  mkdir_cb_cold_4();
  pcStack_10478 = pcVar5;
  pcStack_10470 = unaff_R12;
  puStack_10460 = unaff_R14;
  pcStack_10458 = (code *)unaff_R15;
  if (__s1 == &scandir_req) {
    puVar7 = __s1;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00153d79;
    if (scandir_req.result != 2) goto LAB_00153d7e;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00153d83;
    puVar7 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_10488);
    __s1 = (uv_fs_t *)puStack_10488;
    while (iVar1 != -0xfff) {
      pcVar5 = "file1";
      puStack_10488 = (uv_loop_t *)__s1;
      iVar1 = strcmp((char *)__s1,"file1");
      if (iVar1 != 0) {
        pcVar5 = "file2";
        iVar1 = strcmp((char *)__s1,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00153d74;
        }
      }
      dent_00.name = (char *)(ulong)uStack_10480;
      dent_00._8_8_ = pcVar5;
      assert_is_file_type(dent_00);
      puVar7 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_10488);
      __s1 = (uv_fs_t *)puStack_10488;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00153d88;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00153d8d;
    puVar7 = &scandir_req;
    iVar1 = uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return iVar1;
    }
  }
  else {
LAB_00153d74:
    scandir_cb_cold_1();
    puVar7 = __s1;
LAB_00153d79:
    scandir_cb_cold_2();
LAB_00153d7e:
    scandir_cb_cold_3();
LAB_00153d83:
    scandir_cb_cold_8();
LAB_00153d88:
    scandir_cb_cold_7();
LAB_00153d8d:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar7 < 2) {
    return extraout_EAX;
  }
  assert_is_file_type_cold_1();
  if (puVar7 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00153df5;
    if (stat_req.result != 0) goto LAB_00153dfa;
    if (stat_req.ptr == (void *)0x0) goto LAB_00153dff;
    stat_cb_count = stat_cb_count + 1;
    puVar7 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_00;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00153df5:
    stat_cb_cold_2();
LAB_00153dfa:
    stat_cb_cold_3();
LAB_00153dff:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar7 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00153e41;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(&unlink_req);
      return iVar1;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00153e41:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar7 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00153ea5;
    if (rmdir_req.result != 0) goto LAB_00153eaa;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        iVar1 = uv_fs_req_cleanup(&rmdir_req);
        return iVar1;
      }
      goto LAB_00153eb4;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00153ea5:
    rmdir_cb_cold_2();
LAB_00153eaa:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00153eb4:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_nametoolong) {
  uv_fs_t req;
  int r;
  char name[TOO_LONG_NAME_LENGTH + 1];

  loop = uv_default_loop();

  memset(name, 'a', TOO_LONG_NAME_LENGTH);
  name[TOO_LONG_NAME_LENGTH] = 0;

  r = uv_fs_open(NULL, &req, name, O_RDONLY, 0, NULL);
  ASSERT(r == UV_ENAMETOOLONG);
  ASSERT(req.result == UV_ENAMETOOLONG);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(loop, &req, name, O_RDONLY, 0, open_nametoolong_cb);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}